

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

ngx_int_t ngx_radix32tree_delete(ngx_radix_tree_t *tree,uint32_t key,uint32_t mask)

{
  ngx_radix_node_t *local_30;
  ngx_radix_node_t *node;
  uint32_t bit;
  uint32_t mask_local;
  uint32_t key_local;
  ngx_radix_tree_t *tree_local;
  
  node._4_4_ = 0x80000000;
  local_30 = tree->root;
  for (; local_30 != (ngx_radix_node_t *)0x0 && (node._4_4_ & mask) != 0;
      node._4_4_ = node._4_4_ >> 1) {
    if ((key & node._4_4_) == 0) {
      local_30 = local_30->left;
    }
    else {
      local_30 = local_30->right;
    }
  }
  if (local_30 == (ngx_radix_node_t *)0x0) {
    tree_local = (ngx_radix_tree_t *)0xffffffffffffffff;
  }
  else if ((local_30->right == (ngx_radix_node_t *)0x0) &&
          (local_30->left == (ngx_radix_node_t *)0x0)) {
    do {
      if (local_30->parent->right == local_30) {
        local_30->parent->right = (ngx_radix_node_t *)0x0;
      }
      else {
        local_30->parent->left = (ngx_radix_node_t *)0x0;
      }
      local_30->right = tree->free;
      tree->free = local_30;
      local_30 = local_30->parent;
    } while ((((local_30->right == (ngx_radix_node_t *)0x0) &&
              (local_30->left == (ngx_radix_node_t *)0x0)) &&
             (local_30->value == 0xffffffffffffffff)) &&
            (local_30->parent != (ngx_radix_node_t *)0x0));
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else if (local_30->value == 0xffffffffffffffff) {
    tree_local = (ngx_radix_tree_t *)0xffffffffffffffff;
  }
  else {
    local_30->value = 0xffffffffffffffff;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  return (ngx_int_t)tree_local;
}

Assistant:

ngx_int_t
ngx_radix32tree_delete(ngx_radix_tree_t *tree, uint32_t key, uint32_t mask)
{
    uint32_t           bit;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    node = tree->root;

    while (node && (bit & mask)) {
        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}